

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
mxx::global_scan<int,mxx::min<int>>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,mxx *this,undefined8 in)

{
  allocator_type local_19;
  
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,*(long *)(this + 8) - *(long *)this >> 2,&local_19);
  global_scan<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,mxx::min<int>>
            (*(undefined8 *)this,*(undefined8 *)(this + 8),
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start,1,in);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> global_scan(const std::vector<T>& in, Func func, const mxx::comm& comm = mxx::comm()) {
    std::vector<T> result(in.size());
    global_scan(in.begin(), in.end(), result.begin(), func, true, comm);
    return result;
}